

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::Object::stSize(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar3;
  Oop self;
  anon_union_8_4_0eb573b0_for_Oop_0 local_10;
  
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    local_10._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    local_10.uintValue._4_4_ = extraout_var_00;
    if ((local_10._0_4_ & 7) == 0) {
      bVar1 = Oop::isIndexable((Oop *)&local_10);
      if (bVar1) {
        sVar3 = Oop::getNumberOfElements((Oop *)&local_10);
        iVar2 = (*interpreter->_vptr_InterpreterProxy[0x15])(interpreter,sVar3);
      }
      else {
        iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
      }
      return iVar2;
    }
  }
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar2;
}

Assistant:

int Object::stSize(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto self = interpreter->getReceiver();
	if(!self.isPointer())
        return interpreter->primitiveFailed();

	if(!self.isIndexable())
		return interpreter->primitiveFailed();

	return interpreter->returnSmallInteger(self.getNumberOfElements());
}